

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceArraySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>&,slang::ConstantRange&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *args_3,
          ConstantRange *args_4)

{
  string_view name;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> elements;
  InstanceArraySymbol *pIVar1;
  ConstantRange *in_RCX;
  __extent_storage<18446744073709551615UL> in_RDX;
  undefined8 *in_R8;
  char *in_R9;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pIVar1 = (InstanceArraySymbol *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  name._M_str = in_R9;
  name._M_len = (size_t)*(SourceLocation *)(in_RDX._M_extent_value + 8);
  elements._M_extent._M_extent_value = in_RDX._M_extent_value;
  elements._M_ptr = (pointer)in_RCX;
  slang::ast::InstanceArraySymbol::InstanceArraySymbol
            ((InstanceArraySymbol *)in_R8[1],(Compilation *)*in_R8,name,
             *(SourceLocation *)in_RDX._M_extent_value,elements,*in_RCX);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }